

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Float __thiscall pbrt::PaddedSobolSampler::Get1D(PaddedSobolSampler *this)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint hash;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  Float FVar13;
  undefined1 in_ZMM1 [64];
  
  uVar10 = this->samplesPerPixel;
  uVar6 = this->dimension;
  uVar7 = (long)*Options ^
          (long)(int)uVar6 << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar7 = (uVar7 >> 0x1f ^ uVar7) * 0x7fb5d329728ea185;
  lVar8 = (uVar7 >> 0x1b ^ uVar7) * -0x7e25210b43d22bb3;
  hash = (uint)((ulong)lVar8 >> 0x20);
  uVar9 = hash >> 1 ^ (uint)lVar8;
  uVar4 = this->sampleIndex;
  uVar12 = uVar10 - 1 >> 1 | uVar10 - 1;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  uVar12 = uVar12 >> 0x10 | uVar12;
  do {
    uVar4 = (uVar4 ^ uVar9) * -0x1e8f76c3 ^ uVar9 >> 0x10;
    uVar4 = ((uVar4 & uVar12) >> 4 ^ uVar9 >> 8 ^ uVar4) * 0x929eb3f ^ uVar9 >> 0x17;
    uVar4 = ((uVar4 & uVar12) >> 1 ^ uVar4) * (uVar9 >> 0x1b | 1) * 0x6935fa69;
    uVar4 = ((uVar4 & uVar12) >> 0xb ^ uVar4) * 0x74dcb303;
    uVar4 = ((uVar4 & uVar12) >> 2 ^ uVar4) * -0x61afe33d;
    uVar4 = ((uVar4 & uVar12) >> 2 ^ uVar4) * -0x379f5c21 & uVar12;
    uVar4 = uVar4 >> 5 ^ uVar4;
  } while (uVar10 <= uVar4);
  uVar10 = (uVar4 + uVar9) % uVar10;
  this->dimension = uVar6 + 1;
  if (this->randomizeStrategy != CranleyPatterson) {
    FVar13 = SampleDimension(this,0,uVar10,hash);
    return FVar13;
  }
  if ((-1 < (int)uVar6) &&
     (TVar1 = (this->pixel).super_Tuple2<pbrt::Point2,_int>,
     ((ulong)TVar1 & 0x8000000080000000) == 0)) {
    iVar5 = vcvttss2usi_avx512f(ZEXT416((uint)(((float)*(ushort *)
                                                        (BlueNoiseTextures +
                                                        (ulong)(TVar1.y & 0x7f) * 2 +
                                                        (ulong)((TVar1.x & 0x7fU) << 8) +
                                                        (ulong)(uVar6 % 0x30 << 0xf)) / 65535.0) *
                                              4.2949673e+09)));
    if (uVar10 == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      puVar11 = &SobolMatrices32;
      do {
        if ((uVar10 & 1) != 0) {
          uVar6 = uVar6 ^ *puVar11;
        }
        puVar11 = puVar11 + 1;
        bVar2 = 1 < uVar10;
        uVar10 = (int)uVar10 >> 1;
      } while (bVar2);
    }
    auVar3 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,uVar6 + iVar5);
    auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(auVar3._0_4_ * 2.3283064e-10))
                       );
    return auVar3._0_4_;
  }
  LogFatal<char_const(&)[42]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bluenoise.h"
             ,0x1a,"Check failed: %s",(char (*) [42])"textureIndex >= 0 && p.x >= 0 && p.y >= 0");
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension++;
        // Return randomized 1D van der Corput sample for dimension _dim_
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            // Return 1D sample randomized with Cranley-Patterson rotation
            return SobolSample(index, 0, CranleyPattersonRotator(BlueNoise(dim, pixel)));

        else
            return SampleDimension(0, index, hash >> 32);
    }